

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_param_register_exception_tests_decl.cpp
# Opt level: O1

string * iutest::detail::MakeIndexTypedTestName<exception_value>
                   (string *__return_storage_ptr__,char *basename,size_t index)

{
  runtime_error *this;
  size_t in_RCX;
  
  if (is_throw != '\x01') {
    MakeIndexTestName_abi_cxx11_(__return_storage_ptr__,(detail *)basename,(char *)index,in_RCX);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"HOGE");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

::std::string MakeIndexTypedTestName<exception_value>(const char* basename, size_t index)
{
    if( is_throw )
    {
#if REGISTER_EXCEPTION_TEST_THROW_INT
        IUTEST_SUPPRESS_UNREACHABLE_CODE_WARNING(throw 42);
#else
        IUTEST_SUPPRESS_UNREACHABLE_CODE_WARNING(throw ::std::runtime_error("HOGE"));
#endif
    }
    return MakeIndexTestName(basename, index);
}